

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# System.cc
# Opt level: O3

double Glucose::memUsedPeak(void)

{
  uint uVar1;
  int iVar2;
  FILE *__stream;
  double dVar3;
  int peak_kb;
  char name [256];
  uint local_11c;
  char local_118 [256];
  
  uVar1 = getpid();
  sprintf(local_118,"/proc/%d/status",(ulong)uVar1);
  __stream = fopen(local_118,"rb");
  if (__stream != (FILE *)0x0) {
    local_11c = 0;
    iVar2 = feof(__stream);
    if (iVar2 == 0) {
      do {
        iVar2 = __isoc99_fscanf(__stream,"VmPeak: %d kB",&local_11c);
        if (iVar2 == 1) break;
        do {
          iVar2 = feof(__stream);
          if (iVar2 != 0) break;
          iVar2 = fgetc(__stream);
        } while (iVar2 != 10);
        iVar2 = feof(__stream);
      } while (iVar2 == 0);
    }
    fclose(__stream);
    if (0x7fe < local_11c + 0x3ff) {
      uVar1 = local_11c + 0x3ff;
      if (-1 < (int)local_11c) {
        uVar1 = local_11c;
      }
      return (double)((int)uVar1 >> 10);
    }
  }
  dVar3 = memUsed();
  return dVar3;
}

Assistant:

static inline int memReadPeak(void)
{
    char  name[256];
    pid_t pid = getpid();

    sprintf(name, "/proc/%d/status", pid);
    FILE* in = fopen(name, "rb");
    if (in == NULL) return 0;

    // Find the correct line, beginning with "VmPeak:":
    int peak_kb = 0;
    while (!feof(in) && fscanf(in, "VmPeak: %d kB", &peak_kb) != 1)
        while (!feof(in) && fgetc(in) != '\n')
            ;
    fclose(in);

    return peak_kb;
}